

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderTCTEgl_in::getXFBProperties
          (TessellationShaderTCTEgl_in *this,GLchar ***out_names,GLint *out_n_names,
          GLint *out_xfb_size)

{
  if (out_names != (GLchar ***)0x0) {
    *out_names = getXFBProperties::xfb_varyings;
  }
  if (out_n_names != (GLint *)0x0) {
    *out_n_names = 10;
  }
  if (out_xfb_size != (GLint *)0x0) {
    *out_xfb_size = 0x160;
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_in::getXFBProperties(const glw::GLchar*** out_names, glw::GLint* out_n_names,
												   glw::GLint* out_xfb_size)
{
	static const glw::GLchar* xfb_varyings[] = { "result_float", "result_int",			"result_ivec3",
												 "result_mat2",  "result_struct_test1", "result_struct_test2",
												 "result_uint",  "result_uvec2",		"result_vec4",
												 "gl_Position" };
	static const unsigned int xfb_size = (sizeof(float) +	  /* result_float */
										  sizeof(int) +		   /* result_int */
										  sizeof(int) * 3 +	/* result_ivec3 */
										  sizeof(float) * 4 +  /* result_mat2 */
										  sizeof(int) +		   /* result_struct_test1 */
										  sizeof(float) +	  /* result_struct_test2 */
										  sizeof(int) +		   /* result_uint */
										  sizeof(int) * 2 +	/* result_uvec2 */
										  sizeof(float) * 4 +  /* result_vec4 */
										  sizeof(float) * 4) * /* gl_Position */
										 2;					   /* two points will be generated by tessellation */

	static const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);

	if (out_names != NULL)
	{
		*out_names = xfb_varyings;
	}

	if (out_n_names != NULL)
	{
		*out_n_names = n_xfb_varyings;
	}

	if (out_xfb_size != NULL)
	{
		/* NOTE: Tessellator is expected to generate two points for the purpose of
		 *       this test, which is why we need to multiply the amount of bytes store
		 *       in xfb_size by two.
		 */
		*out_xfb_size = xfb_size * 2;
	}
}